

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

bool __thiscall
soplex::SoPlexBase<double>::getPrimalReal(SoPlexBase<double> *this,double *p_vector,int size)

{
  pointer __src;
  size_t __n;
  bool bVar1;
  
  if ((((this->_hasSolReal | this->_hasSolRational) & 1U) == 0) ||
     (size < (this->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum)) {
    bVar1 = false;
  }
  else {
    if (((this->_hasSolReal | ~this->_hasSolRational) & 1U) == 0) {
      SolBase<double>::operator=(&this->_solReal,&this->_solRational);
      this->_hasSolReal = true;
    }
    __src = (this->_solReal)._primal.val.super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start;
    bVar1 = true;
    __n = (long)(this->_solReal)._primal.val.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)__src;
    if (__n != 0) {
      memmove(p_vector,__src,__n);
    }
  }
  return bVar1;
}

Assistant:

bool SoPlexBase<R>::getPrimalReal(R* p_vector, int size)
{
   if(hasSol() && size >= numCols())
   {
      _syncRealSolution();

      auto& primal = _solReal._primal;
      std::copy(primal.begin(), primal.end(), p_vector);

      return true;
   }
   else
      return false;
}